

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O1

void __thiscall AllFloatsParseTest::RunShard(AllFloatsParseTest *this,int shard)

{
  int iVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  char *message;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  AssertionResult gtest_ar;
  uint32_t me;
  char buffer [100];
  float local_c4;
  internal local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  Message local_b0;
  AssertHelper local_a8;
  uint32_t local_9c;
  char local_98 [104];
  
  uVar2 = CONCAT44(in_register_00000034,shard);
  uVar3 = 0xffffffff;
  local_c4 = (float)shard;
  do {
    if ((shard == 0) && (uVar4 = (uint)(uVar2 >> 0x18) & 0xff, uVar4 != uVar3)) {
      printf("value: 0x%08x (%d%%)\r",uVar2,
             (ulong)(uint)(int)(((double)(uVar2 & 0xffffffff) * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar3 = uVar4;
    }
    if ((~(uint)local_c4 & 0x7f800000) != 0) {
      iVar1 = snprintf(local_98,100,"%a",(double)local_c4);
      local_b0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      local_a8.data_._0_4_ = wabt::ParseFloat(Hexfloat,local_98,local_98 + iVar1,&local_9c);
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                (local_c0,"Result::Ok",
                 "ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me)",(Enum *)&local_b0,
                 (Result *)&local_a8);
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message(&local_b0);
        if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_b8->_M_dataplus)._M_p;
        }
        iVar1 = 0x6e;
LAB_0010af82:
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-hexfloat.cc"
                   ,iVar1,message);
        testing::internal::AssertHelper::operator=(&local_a8,&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if ((long *)CONCAT44(local_b0.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             local_b0.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_b0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_b0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_) + 8))();
        }
        if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
        return;
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_c0,"me","bits",&local_9c,(uint *)&local_c4);
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message(&local_b0);
        if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_b8->_M_dataplus)._M_p;
        }
        iVar1 = 0x6f;
        goto LAB_0010af82;
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
    }
    uVar4 = (this->super_ThreadedTest).num_threads_;
    bVar5 = CARRY4(uVar4,(uint)local_c4);
    local_c4 = (float)(uVar4 + (int)local_c4);
    uVar2 = (ulong)(uint)local_c4;
    if (bVar5) {
      if (shard == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      float value = bit_cast<float>(bits);
      int len = snprintf(buffer, sizeof(buffer), "%a", value);

      uint32_t me;
      ASSERT_EQ(Result::Ok,
                ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me));
      ASSERT_EQ(me, bits);
    }
    LOG_DONE();
  }